

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

size_t CLI::detail::escape_detect(string *str,size_t offset)

{
  pointer pcVar1;
  uint uVar2;
  size_type sVar3;
  
  uVar2 = (byte)(str->_M_dataplus)._M_p[offset + 1] - 0x22;
  if ((uVar2 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(str,"-/ \"\'`",offset - 1);
    if ((sVar3 != 0xffffffffffffffff) &&
       (pcVar1 = (str->_M_dataplus)._M_p,
       (uint)(pcVar1[offset] != '=') * 2 + 0x2d == (int)pcVar1[sVar3])) {
      pcVar1[offset] = ' ';
    }
  }
  return offset + 1;
}

Assistant:

CLI11_INLINE std::size_t escape_detect(std::string &str, std::size_t offset) {
    auto next = str[offset + 1];
    if((next == '\"') || (next == '\'') || (next == '`')) {
        auto astart = str.find_last_of("-/ \"\'`", offset - 1);
        if(astart != std::string::npos) {
            if(str[astart] == ((str[offset] == '=') ? '-' : '/'))
                str[offset] = ' ';  // interpret this as a space so the split_up works properly
        }
    }
    return offset + 1;
}